

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_start_str_notrack(mpack_writer_t *writer,uint32_t count)

{
  _Bool _Var1;
  uint8_t *u;
  byte *pbVar2;
  long lVar3;
  uint8_t *u_1;
  char *pcVar4;
  
  if (count < 0x20) {
    pbVar2 = (byte *)writer->current;
    if ((byte *)writer->end == pbVar2) {
      _Var1 = mpack_writer_ensure(writer,1);
      if (!_Var1) {
        return;
      }
      pbVar2 = (byte *)writer->current;
    }
    *pbVar2 = (byte)count | 0xa0;
    lVar3 = 1;
  }
  else {
    if (count < 0x100) {
      if (mpack_version_v4 < writer->version) {
        pcVar4 = writer->current;
        if ((ulong)((long)writer->end - (long)pcVar4) < 2) {
          _Var1 = mpack_writer_ensure(writer,2);
          if (!_Var1) {
            return;
          }
          pcVar4 = writer->current;
        }
        lVar3 = 2;
        *pcVar4 = -0x27;
        pcVar4[1] = (byte)count;
        goto LAB_00105a8d;
      }
    }
    else if (0xffff < count) {
      pcVar4 = writer->current;
      if ((ulong)((long)writer->end - (long)pcVar4) < 5) {
        _Var1 = mpack_writer_ensure(writer,5);
        if (!_Var1) {
          return;
        }
        pcVar4 = writer->current;
      }
      lVar3 = 5;
      *pcVar4 = -0x25;
      *(uint32_t *)(pcVar4 + 1) =
           count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
      goto LAB_00105a8d;
    }
    pcVar4 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar4) < 3) {
      _Var1 = mpack_writer_ensure(writer,3);
      if (!_Var1) {
        return;
      }
      pcVar4 = writer->current;
    }
    lVar3 = 3;
    *pcVar4 = -0x26;
    *(ushort *)(pcVar4 + 1) = (ushort)count << 8 | (ushort)count >> 8;
  }
LAB_00105a8d:
  writer->current = writer->current + lVar3;
  return;
}

Assistant:

static void mpack_start_str_notrack(mpack_writer_t* writer, uint32_t count) {
    if (count <= 31) {
        MPACK_WRITE_ENCODED(mpack_encode_fixstr, MPACK_TAG_SIZE_FIXSTR, (uint8_t)count);

    // str8 is only supported in v5 or later.
    } else if (count <= UINT8_MAX
            #if MPACK_COMPATIBILITY
            && writer->version >= mpack_version_v5
            #endif
            ) {
        MPACK_WRITE_ENCODED(mpack_encode_str8, MPACK_TAG_SIZE_STR8, (uint8_t)count);

    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_str16, MPACK_TAG_SIZE_STR16, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_str32, MPACK_TAG_SIZE_STR32, (uint32_t)count);
    }
}